

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExtract.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkShareXor(Abc_Ntk_t *pNtk,int nMultiSize,int fAnd,int fVerbose)

{
  Abc_ShaMan_t *p;
  Abc_Ntk_t *pAVar1;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExtract.c"
                  ,0x2d4,"Abc_Ntk_t *Abc_NtkShareXor(Abc_Ntk_t *, int, int, int)");
  }
  p = Abc_ShaManStart(pNtk);
  p->nMultiSize = nMultiSize;
  p->fVerbose = fVerbose;
  Abc_NtkTraverseSupers(p,fAnd);
  if (p->nStartCols < 2) {
    Abc_ShaManStop(p);
    pAVar1 = Abc_NtkDup(pNtk);
    return pAVar1;
  }
  if (fVerbose == 0) {
    Abc_NtkShareOptimize(p,fAnd);
  }
  else {
    Abc_NtkSharePrint(p);
    Abc_NtkShareOptimize(p,fAnd);
    Abc_NtkSharePrint(p);
  }
  pAVar1 = Abc_NtkUpdateNetwork(p,fAnd);
  Abc_ShaManStop(p);
  return pAVar1;
}

Assistant:

Abc_Ntk_t * Abc_NtkShareXor( Abc_Ntk_t * pNtk, int nMultiSize, int fAnd, int fVerbose )
{
    Abc_Ntk_t * pNtkNew;
    Abc_ShaMan_t * p;
    assert( Abc_NtkIsStrash(pNtk) );
//    Abc_NtkDumpBlif( pNtk );
    p = Abc_ShaManStart( pNtk );
    p->nMultiSize = nMultiSize;
    p->fVerbose   = fVerbose;
    Abc_NtkTraverseSupers( p, fAnd );
    if ( p->nStartCols < 2 )
    {
        Abc_ShaManStop( p );
        return Abc_NtkDup( pNtk );
    }
    if ( fVerbose )
        Abc_NtkSharePrint( p );
    Abc_NtkShareOptimize( p, fAnd );
    if ( fVerbose )
        Abc_NtkSharePrint( p );
    pNtkNew = Abc_NtkUpdateNetwork( p, fAnd );
    Abc_ShaManStop( p );
    return pNtkNew;
}